

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O1

void __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Texture2DGradientTestCase
          (Texture2DGradientTestCase *this,TestContext *testCtx,char *name,char *desc,
          TextureFormat format,IVec3 *dimensions,VkFilter magFilter,VkFilter minFilter,
          VkSamplerMipmapMode mipmapFilter,VkSamplerAddressMode wrappingMode,bool useDerivatives)

{
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  LookupLodMode LVar5;
  TestCaseData *pTVar6;
  int i;
  VkFormat VVar7;
  long lVar8;
  long *plVar9;
  uint uVar10;
  long *plVar11;
  size_type *psVar12;
  undefined8 *puVar13;
  ImageViewParameters *pIVar14;
  int iVar15;
  byte bVar16;
  TestCaseData data;
  string local_238;
  VarType local_218;
  long lStack_200;
  ShaderSpec *local_1f8;
  VkFilter local_1ec;
  string *local_1e8;
  string *local_1e0;
  Symbol local_1d8;
  VkFilter local_1a0;
  VkFilter local_19c;
  VkFilter local_198;
  VkSamplerMipmapMode local_194;
  VkSamplerMipmapMode local_190;
  VkSamplerMipmapMode local_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined2 local_178;
  uint local_174;
  undefined2 local_170;
  undefined4 local_16c;
  ios_base local_168 [272];
  TestCaseData *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_1ec = (VkFilter)dimensions;
  bVar16 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,name,(allocator<char> *)&local_218);
  paVar1 = &local_238.field_2;
  local_238.field_2._M_allocated_capacity._0_4_ = 0x2e2e2e;
  local_238._M_string_length = 3;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  tcu::TestCase::TestCase
            ((TestCase *)this,testCtx,local_1d8.name._M_dataplus._M_p,paVar1->_M_local_buf);
  (this->super_TextureFilteringTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TestCase_00d4f460;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  lVar8 = 0;
  (this->super_TextureFilteringTestCase).m_executor.
  super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  .m_data.ptr = (ShaderExecutor *)0x0;
  local_58 = &(this->super_TextureFilteringTestCase).m_testCaseData;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar6 = &(this->super_TextureFilteringTestCase).m_testCaseData;
  (pTVar6->imParams).size.m_data[0] = 0;
  (pTVar6->imParams).size.m_data[1] = 0;
  (this->super_TextureFilteringTestCase).m_testCaseData.imParams.size.m_data[2] = 0;
  local_1f8 = &(this->super_TextureFilteringTestCase).m_shaderSpec;
  local_1e8 = (string *)&(this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations._M_dataplus._M_p =
       (pointer)&(this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations.field_2;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations._M_string_length = 0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations.field_2._M_local_buf[0] =
       '\0';
  local_1e0 = (string *)&(this->super_TextureFilteringTestCase).m_shaderSpec.source;
  (this->super_TextureFilteringTestCase).m_shaderSpec.source._M_dataplus._M_p =
       (pointer)&(this->super_TextureFilteringTestCase).m_shaderSpec.source.field_2;
  (this->super_TextureFilteringTestCase).m_shaderSpec.source._M_string_length = 0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.source.field_2._M_local_buf[0] = '\0';
  (this->super_TextureFilteringTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TextureFilteringTestCase_00d66bf0;
  this->m_format = (TextureFormat)desc;
  do {
    (this->m_dimensions).m_data[lVar8] = *(int *)((long)format + lVar8 * 4);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  this->m_magFilter = local_1ec;
  this->m_minFilter = magFilter;
  this->m_mipmapFilter = minFilter;
  this->m_wrappingMode = mipmapFilter;
  this->m_useDerivatives = (bool)(undefined1)wrappingMode;
  uVar10 = (this->m_dimensions).m_data[0];
  uVar4 = (this->m_dimensions).m_data[1];
  VVar7 = ::vk::mapTextureFormat(&this->m_format);
  local_1d8.name.field_2._8_8_ = (ulong)VVar7 << 0x20 | 2;
  local_1d8.name._M_dataplus._M_p = (pointer)0x0;
  local_1d8.name._M_string_length = 0;
  local_1d8.name.field_2._M_allocated_capacity = 0;
  local_1d8.varType.m_type = (this->m_dimensions).m_data[0];
  local_1d8.varType._4_4_ = (this->m_dimensions).m_data[1];
  local_1d8.varType.m_data.basic.type = (this->m_dimensions).m_data[2];
  if ((int)uVar4 < (int)uVar10) {
    uVar4 = uVar10;
  }
  uVar10 = 0x20;
  if (uVar4 != 0) {
    uVar10 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar10 = uVar10 ^ 0x1f;
  }
  local_1d8.varType.m_data.basic.precision = 0x20 - uVar10;
  local_1d8.varType.m_data.array.size._0_1_ = 0;
  local_1d8.varType.m_data._12_4_ = 1;
  local_1a0 = local_1ec;
  local_19c = magFilter;
  local_198 = minFilter;
  local_194 = mipmapFilter;
  local_190 = mipmapFilter;
  local_18c = mipmapFilter;
  local_188 = 4;
  uStack_184 = 0;
  uStack_180 = 0xbf800000;
  uStack_17c = 0x42480000;
  iVar15 = 0;
  local_178 = 0;
  local_174 = (uint)(byte)((undefined1)wrappingMode ^ VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT);
  local_170 = 0;
  local_16c = 1;
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  _M_move_assign(&local_58->pba,&local_1d8);
  puVar13 = (undefined8 *)((long)&local_1d8.name.field_2 + 8);
  pIVar14 = &(this->super_TextureFilteringTestCase).m_testCaseData.imParams;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar2 = *puVar13;
    pIVar14->dim = (int)uVar2;
    pIVar14->format = (int)((ulong)uVar2 >> 0x20);
    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
    pIVar14 = (ImageViewParameters *)((long)pIVar14 + (ulong)bVar16 * -0x10 + 8);
  }
  if (local_1d8.name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1d8.name._M_dataplus._M_p,
                    local_1d8.name.field_2._M_allocated_capacity -
                    (long)local_1d8.name._M_dataplus._M_p);
  }
  uVar10 = (this->super_TextureFilteringTestCase).m_testCaseData.imParams.dim - IMG_DIM_1D;
  if (uVar10 < 4) {
    iVar15 = *(int *)(&DAT_00b82750 + (ulong)uVar10 * 4);
  }
  bVar3 = (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare;
  bVar16 = (uint)(this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.
                 isProjective + iVar15 == 4 & bVar3;
  uVar10 = 0;
  if (bVar16 == 0) {
    uVar10 = (uint)bVar3;
  }
  iVar15 = uVar10 + (this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed;
  local_1d8.name._M_dataplus._M_p = (pointer)&local_1d8.name.field_2;
  local_1d8.name.field_2._M_allocated_capacity._0_4_ = 0x636576;
  local_1d8.name._M_string_length = 3;
  std::__cxx11::string::push_back((char)&local_1d8);
  std::__cxx11::string::append((char *)&local_1d8);
  std::__cxx11::string::push_back((char)&local_1d8);
  std::__cxx11::string::append((char *)&local_1d8);
  if ((this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed == true) {
    std::__cxx11::string::append((char *)&local_1d8);
    iVar15 = iVar15 + -1;
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare == true &&
      bVar16 == 0) {
    std::__cxx11::string::append((char *)&local_1d8);
    iVar15 = iVar15 + -1;
  }
  if (0 < iVar15) {
    do {
      std::__cxx11::string::append((char *)&local_1d8);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  std::__cxx11::string::append((char *)&local_1d8);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity =
       local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::append((char *)&local_238);
  if ((this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.isProjective ==
      true) {
    std::__cxx11::string::append((char *)&local_238);
  }
  LVar5 = (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.lookupLodMode;
  if ((LVar5 == LOOKUP_LOD_MODE_DERIVATIVES) || (LVar5 == LOOKUP_LOD_MODE_LOD)) {
    std::__cxx11::string::append((char *)&local_238);
  }
  std::__cxx11::string::append((char *)&local_238);
  std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1d8.name._M_dataplus._M_p);
  if ((bVar16 & (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare) == 1)
  {
    std::__cxx11::string::append((char *)&local_238);
  }
  LVar5 = (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.lookupLodMode;
  if (LVar5 != LOOKUP_LOD_MODE_LOD) {
    if (LVar5 != LOOKUP_LOD_MODE_DERIVATIVES) goto LAB_0081b210;
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::push_back((char)&local_238);
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::push_back((char)&local_238);
  }
  std::__cxx11::string::append((char *)&local_238);
LAB_0081b210:
  std::__cxx11::string::append((char *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::__cxx11::string::operator=(local_1e0,(string *)&local_238);
  paVar1 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_1e0);
  local_238._M_string_length = 6;
  local_238.field_2._M_allocated_capacity._0_7_ = 0x746c75736572;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(&local_1d8,&local_238,&local_218);
  this_00 = &(this->super_TextureFilteringTestCase).m_shaderSpec.outputs;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(this_00,&local_1d8);
  glu::VarType::~VarType(&local_1d8.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238.field_2._M_allocated_capacity = 0x4364656c706d6173;
  local_238._M_string_length = 0xc;
  local_238.field_2._8_5_ = 0x64726f6f;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(&local_1d8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(this_00,&local_1d8);
  glu::VarType::~VarType(&local_1d8.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238.field_2._M_allocated_capacity._0_6_ = 0x64726f6f63;
  local_238._M_string_length = 5;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(&local_1d8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&local_1f8->inputs,&local_1d8);
  glu::VarType::~VarType(&local_1d8.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238.field_2._M_allocated_capacity._0_6_ = 0x726579616c;
  local_238._M_string_length = 5;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(&local_1d8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&local_1f8->inputs,&local_1d8);
  glu::VarType::~VarType(&local_1d8.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_string_length = 4;
  local_238.field_2._M_allocated_capacity._0_5_ = 0x66655264;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(&local_1d8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&local_1f8->inputs,&local_1d8);
  glu::VarType::~VarType(&local_1d8.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_string_length = 4;
  local_238.field_2._M_allocated_capacity._0_5_ = 0x78645064;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(&local_1d8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&local_1f8->inputs,&local_1d8);
  glu::VarType::~VarType(&local_1d8.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_string_length = 4;
  local_238.field_2._M_allocated_capacity._0_5_ = 0x79645064;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(&local_1d8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&local_1f8->inputs,&local_1d8);
  glu::VarType::~VarType(&local_1d8.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238.field_2._M_allocated_capacity._0_4_ = 0x646f6c;
  local_238._M_string_length = 3;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(&local_1d8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&local_1f8->inputs,&local_1d8);
  glu::VarType::~VarType(&local_1d8.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d8);
  std::ostream::operator<<(&local_1d8,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d8);
  std::ios_base::~ios_base(local_168);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0xb827ff);
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_218.m_data._8_8_ = *plVar11;
    lStack_200 = plVar9[3];
    local_218._0_8_ = (long)&local_218 + 0x10U;
  }
  else {
    local_218.m_data._8_8_ = *plVar11;
    local_218._0_8_ = (long *)*plVar9;
  }
  local_218.m_data.basic = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar9 + 1);
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_218);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_238.field_2._M_allocated_capacity = *psVar12;
    local_238.field_2._8_8_ = plVar9[3];
    local_238._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar12;
    local_238._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_238._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=(local_1e8,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_218._0_8_ != (long)&local_218 + 0x10U) {
    operator_delete((void *)local_218._0_8_,local_218.m_data._8_8_ + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_1d8.name._M_dataplus._M_p = (pointer)&local_1d8.name.field_2;
  local_1d8.name._M_string_length = 7;
  local_1d8.name.field_2._M_allocated_capacity = 0x72656c706d6173;
  if ((this->super_TextureFilteringTestCase).m_testCaseData.imParams.dim - IMG_DIM_1D < 4) {
    std::__cxx11::string::append((char *)&local_1d8);
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed == true) {
    std::__cxx11::string::append((char *)&local_1d8);
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare == true) {
    std::__cxx11::string::append((char *)&local_1d8);
  }
  std::__cxx11::string::_M_append((char *)local_1e8,(ulong)local_1d8.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::__cxx11::string::append((char *)local_1e8);
  return;
}

Assistant:

Texture2DGradientTestCase (TestContext&			testCtx,
							   const char*			name,
							   const char*			desc,
							   TextureFormat		format,
							   IVec3				dimensions,
							   VkFilter				magFilter,
							   VkFilter				minFilter,
							   VkSamplerMipmapMode	mipmapFilter,
							   VkSamplerAddressMode	wrappingMode,
							   bool					useDerivatives)

		: TextureFilteringTestCase	(testCtx, name, desc)
		, m_format					(format)
		, m_dimensions				(dimensions)
		, m_magFilter				(magFilter)
		, m_minFilter				(minFilter)
		, m_mipmapFilter			(mipmapFilter)
		, m_wrappingMode			(wrappingMode)
		, m_useDerivatives			(useDerivatives)
	{
		m_testCaseData = genTestCaseData();
		initSpec();
	}